

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_task.cpp
# Opt level: O2

void __thiscall
duckdb::ExecutorTask::ExecutorTask
          (ExecutorTask *this,ClientContext *context_p,shared_ptr<duckdb::Event,_true> *event_p,
          PhysicalOperator *op_p)

{
  atomic<unsigned_long> *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_> __p;
  Executor *pEVar4;
  __uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_> local_30;
  
  (this->super_Task).super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
  super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Task).super_enable_shared_from_this<duckdb::Task>.__weak_this_.internal.
  super___weak_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Task).token.ptr = (ProducerToken *)0x0;
  (this->super_Task)._vptr_Task = (_func_int **)&PTR__ExecutorTask_027c5328;
  pEVar4 = ClientContext::GetExecutor(context_p);
  this->executor = pEVar4;
  (this->event).internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->event).internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar2;
  (this->event).internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var3;
  (event_p->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->thread_context).
  super_unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super___uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl = (ThreadContext *)0x0;
  (this->op).ptr = op_p;
  this->context = context_p;
  make_uniq<duckdb::ThreadContext,duckdb::ClientContext&>((duckdb *)&local_30,context_p);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl =
       local_30._M_t.
       super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
       super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl;
  local_30._M_t.
  super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>.
  super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl =
       (tuple<duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>)
       (_Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>)0x0;
  ::std::__uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>::reset
            ((__uniq_ptr_impl<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_> *)
             &this->thread_context,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_duckdb::ThreadContext_*,_std::default_delete<duckdb::ThreadContext>_>
                      .super__Head_base<0UL,_duckdb::ThreadContext_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_>::~unique_ptr
            ((unique_ptr<duckdb::ThreadContext,_std::default_delete<duckdb::ThreadContext>_> *)
             &local_30);
  LOCK();
  paVar1 = &this->executor->executor_tasks;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

ExecutorTask::ExecutorTask(ClientContext &context_p, shared_ptr<Event> event_p, const PhysicalOperator &op_p)
    : executor(Executor::Get(context_p)), event(std::move(event_p)), op(&op_p), context(context_p) {
	thread_context = make_uniq<ThreadContext>(context_p);
	executor.RegisterTask();
}